

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall capnp::JsonCodec::JsonCodec(JsonCodec *this)

{
  Impl *this_00;
  
  this_00 = (Impl *)operator_new(0x138);
  memset(this_00,0,0x138);
  Impl::Impl(this_00);
  (this->impl).disposer = (Disposer *)&kj::_::HeapDisposer<capnp::JsonCodec::Impl>::instance;
  (this->impl).ptr = this_00;
  return;
}

Assistant:

JsonCodec::JsonCodec()
    : impl(kj::heap<Impl>()) {}